

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O2

Cut_Cut_t * Cut_CutMergeTwo3(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  Cut_Cut_t *pCVar3;
  uint uVar4;
  ulong uVar5;
  Cut_Cut_t *pCVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  uVar9 = *(uint *)pCut0;
  uVar7 = uVar9 >> 0x1c;
  uVar4 = *(uint *)pCut1 >> 0x1c;
  if (uVar7 < uVar4) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutMerge.c"
                  ,0x11c,"Cut_Cut_t *Cut_CutMergeTwo3(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  pCVar3 = p->pReady;
  if (pCVar3 == (Cut_Cut_t *)0x0) {
    pCVar3 = Cut_CutAlloc(p);
    p->pReady = pCVar3;
    uVar9 = *(uint *)pCut0;
    uVar7 = uVar9 >> 0x1c;
    uVar4 = *(uint *)pCut1 >> 0x1c;
  }
  pCVar6 = pCVar3 + 1;
  uVar10 = p->pParams->nVarsMax;
  uVar5 = (ulong)uVar10;
  if (uVar7 == uVar10) {
    if (uVar4 == uVar10) {
      uVar8 = 0;
      while (uVar5 != uVar8) {
        uVar4 = *(uint *)(&pCut0[1].field_0x0 + uVar8 * 4);
        *(uint *)((long)&pCVar6->field_0x0 + uVar8 * 4) = uVar4;
        lVar11 = uVar8 * 4;
        uVar8 = uVar8 + 1;
        if (uVar4 != *(uint *)(&pCut1[1].field_0x0 + lVar11)) {
          return (Cut_Cut_t *)0x0;
        }
      }
    }
    else {
      uVar7 = 0;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        uVar10 = *(uint *)(&pCut0[1].field_0x0 + uVar8 * 4);
        *(uint *)((long)&pCVar6->field_0x0 + uVar8 * 4) = uVar10;
        uVar1 = uVar4;
        if ((uVar7 != uVar4) &&
           (uVar1 = uVar7, (int)*(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar7 * 4) <= (int)uVar10
           )) {
          if (uVar10 != *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar7 * 4)) {
            return (Cut_Cut_t *)0x0;
          }
          uVar1 = uVar7 + 1;
        }
        uVar7 = uVar1;
      }
      if ((int)uVar7 < (int)uVar4) {
        return (Cut_Cut_t *)0x0;
      }
    }
    uVar8 = (ulong)(uVar9 & 0xf0000000);
  }
  else {
    uVar8 = 0;
    if ((int)uVar10 < 1) {
      uVar5 = 0;
    }
    uVar9 = 0;
    uVar10 = 0;
    for (; uVar5 << 0x1c != uVar8; uVar8 = uVar8 + 0x10000000) {
      if (uVar10 == uVar4) {
        if (uVar9 == uVar7) goto LAB_0070e794;
        *(uint *)pCVar6 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar9 * 4);
        uVar9 = uVar9 + 1;
        uVar10 = uVar4;
      }
      else {
        lVar11 = (long)(int)uVar10;
        if (uVar9 == uVar7) {
          uVar10 = uVar10 + 1;
          *(uint *)pCVar6 = *(uint *)(&pCut1[1].field_0x0 + lVar11 * 4);
          uVar9 = uVar7;
        }
        else {
          uVar1 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar9 * 4);
          uVar2 = *(uint *)(&pCut1[1].field_0x0 + lVar11 * 4);
          if ((int)uVar1 < (int)uVar2) {
            uVar9 = uVar9 + 1;
            *(uint *)pCVar6 = uVar1;
          }
          else if ((int)uVar2 < (int)uVar1) {
            uVar10 = uVar10 + 1;
            *(uint *)pCVar6 = uVar2;
          }
          else {
            uVar9 = uVar9 + 1;
            *(uint *)pCVar6 = uVar1;
            uVar10 = uVar10 + 1;
          }
        }
      }
      pCVar6 = (Cut_Cut_t *)&pCVar6->uSign;
    }
    if ((int)uVar9 < (int)uVar7) {
      return (Cut_Cut_t *)0x0;
    }
    if ((int)uVar10 < (int)uVar4) {
      return (Cut_Cut_t *)0x0;
    }
    uVar8 = (ulong)(uint)((int)uVar5 << 0x1c);
  }
LAB_0070e794:
  *(uint *)pCVar3 = *(uint *)pCVar3 & 0xfffffff | (uint)uVar8;
  pCVar3 = p->pReady;
  p->pReady = (Cut_Cut_t *)0x0;
  return pCVar3;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo3( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // consider two cuts
    Limit = p->pParams->nVarsMax;
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;
    if ( nLeaves0 == Limit )
    { // the case when one of the cuts is the largest
        if ( nLeaves1 == Limit )
        { // the case when both cuts are the largest
            for ( i = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( pLeaves[i] != pCut1->pLeaves[i] )
                    return NULL;
            }
        }
        else
        {
            for ( i = k = 0; i < nLeaves0; i++ )
            {
                pLeaves[i] = pCut0->pLeaves[i];
                if ( k == (int)nLeaves1 )
                    continue;
                if ( pLeaves[i] < pCut1->pLeaves[k] )
                    continue;
                if ( pLeaves[i] == pCut1->pLeaves[k++] )
                    continue;
                return NULL;
            }
            if ( k < nLeaves1 )
                return NULL;
        }
        p->pReady->nLeaves = nLeaves0;
        pRes = p->pReady;  p->pReady = NULL;
        return pRes;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}